

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

int __thiscall
ON_NurbsSurface::CreateRuledSurface
          (ON_NurbsSurface *this,ON_Curve *curveA,ON_Curve *curveB,ON_Interval *curveA_domain,
          ON_Interval *curveB_domain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int desired_dimension;
  double *pdVar5;
  ON_NurbsCurve *pOVar6;
  ON_NurbsCurve nurbs_curveA;
  ON_NurbsCurve nurbs_curveB;
  ON_NurbsCurve local_b0;
  ON_NurbsCurve local_70;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  ON_NurbsCurve::ON_NurbsCurve(&local_b0);
  ON_NurbsCurve::ON_NurbsCurve(&local_70);
  if ((this->m_cv != (double *)0x0) && (this->m_cv_capacity == 0)) {
    local_b0.m_cv = this->m_cv;
  }
  if ((this->m_knot[0] != (double *)0x0) && (this->m_knot_capacity[0] == 0)) {
    local_b0.m_knot = this->m_knot[0];
  }
  iVar2 = (*(curveA->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                    (0,curveA,&local_b0,curveA_domain);
  iVar4 = 0;
  if ((((iVar2 < 1) ||
       (iVar3 = (*(curveB->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                          (0,curveB,&local_70,curveB_domain), iVar3 < 1)) ||
      (bVar1 = ON_Internal_MakeKnotVectorsCompatible(&local_b0,&local_70), !bVar1)) ||
     ((iVar4 = 0, local_b0.m_cv_count != local_70.m_cv_count ||
      (local_b0.m_order != local_70.m_order)))) goto LAB_00549385;
  iVar4 = ON_NurbsCurve::Dimension(&local_b0);
  desired_dimension = 3;
  if (3 < iVar4) {
    desired_dimension = ON_NurbsCurve::Dimension(&local_b0);
  }
  iVar4 = ON_NurbsCurve::Dimension(&local_70);
  if (desired_dimension < iVar4) {
    desired_dimension = ON_NurbsCurve::Dimension(&local_70);
  }
  pOVar6 = &local_b0;
  iVar4 = ON_NurbsCurve::Dimension(pOVar6);
  if (iVar4 < desired_dimension) {
LAB_00549225:
    ON_NurbsCurve::ChangeDimension(pOVar6,desired_dimension);
  }
  else {
    pOVar6 = &local_70;
    iVar4 = ON_NurbsCurve::Dimension(pOVar6);
    if (iVar4 < desired_dimension) goto LAB_00549225;
  }
  bVar1 = ON_NurbsCurve::IsRational(&local_b0);
  pOVar6 = &local_70;
  if ((bVar1) || (bVar1 = ON_NurbsCurve::IsRational(&local_70), pOVar6 = &local_b0, bVar1)) {
    ON_NurbsCurve::MakeRational(pOVar6);
  }
  bVar1 = local_b0.m_is_rat != 0;
  if (bVar1) {
    local_b0.m_is_rat = 0;
    local_b0.m_dim = local_b0.m_dim + 1;
  }
  ON_NurbsCurve::ChangeDimension(&local_b0,local_b0.m_dim * 2);
  local_b0.m_is_rat = (int)bVar1;
  local_b0.m_dim = desired_dimension;
  if ((this->m_cv != (double *)0x0) && (0 < this->m_cv_capacity)) {
    onfree(this->m_cv);
  }
  this->m_cv = local_b0.m_cv;
  this->m_cv_capacity = local_b0.m_cv_capacity;
  local_b0.m_cv_capacity = 0;
  if ((this->m_knot[0] != (double *)0x0) && (0 < this->m_knot_capacity[0])) {
    onfree(this->m_knot[0]);
  }
  ON_NurbsCurve::UnmanageKnotForExperts(&local_b0,this->m_knot_capacity,this->m_knot);
  ReserveKnotCapacity(this,1,2);
  pdVar5 = this->m_knot[1];
  *(undefined4 *)pdVar5 = 0;
  *(undefined4 *)((long)pdVar5 + 4) = 0;
  *(undefined4 *)(pdVar5 + 1) = 0;
  *(undefined4 *)((long)pdVar5 + 0xc) = 0x3ff00000;
  this->m_dim = desired_dimension;
  this->m_is_rat = local_b0.m_is_rat;
  this->m_order[0] = local_b0.m_order;
  this->m_order[1] = 2;
  this->m_cv_count[0] = local_b0.m_cv_count;
  this->m_cv_count[1] = 2;
  this->m_cv_stride[0] = local_b0.m_cv_stride;
  this->m_cv_stride[1] = local_b0.m_cv_stride / 2;
  if (0 < local_b0.m_cv_count) {
    iVar4 = 0;
    do {
      pdVar5 = ON_NurbsCurve::CV(&local_70,iVar4);
      SetCV(this,iVar4,1,intrinsic_point_style,pdVar5);
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->m_cv_count[0]);
  }
  iVar4 = iVar3;
  if (iVar3 < iVar2) {
    iVar4 = iVar2;
  }
LAB_00549385:
  ON_NurbsCurve::~ON_NurbsCurve(&local_70);
  ON_NurbsCurve::~ON_NurbsCurve(&local_b0);
  return iVar4;
}

Assistant:

int ON_NurbsSurface::CreateRuledSurface(
       const ON_Curve& curveA,
       const ON_Curve& curveB,
       const ON_Interval* curveA_domain,
       const ON_Interval* curveB_domain
       )
{
  DestroySurfaceTree();
  int rcA=1, rcB=1;
  ON_NurbsCurve nurbs_curveA, nurbs_curveB;
  if ( m_cv && m_cv_capacity == 0 )
    nurbs_curveA.m_cv = m_cv;
  if ( m_knot[0] && m_knot_capacity[0] == 0 )
    nurbs_curveA.m_knot = m_knot[0];
  rcA = curveA.GetNurbForm( nurbs_curveA, 0.0, curveA_domain );
  if ( rcA<=0 )
    return 0;
  rcB = curveB.GetNurbForm( nurbs_curveB, 0.0, curveB_domain );
  if ( rcB<=0 )
    return 0;

  if ( !ON_Internal_MakeKnotVectorsCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;

  if ( nurbs_curveA.m_cv_count != nurbs_curveB.m_cv_count )
    return 0;
  if ( nurbs_curveA.m_order != nurbs_curveB.m_order )
    return 0;

  int srf_dim = 3;
  if ( nurbs_curveA.Dimension() > srf_dim )
    srf_dim = nurbs_curveA.Dimension();
  if ( nurbs_curveB.Dimension() > srf_dim )
    srf_dim = nurbs_curveB.Dimension();

  if (nurbs_curveA.Dimension() < srf_dim )
    nurbs_curveA.ChangeDimension(srf_dim);
  else if (nurbs_curveB.Dimension() < srf_dim )
    nurbs_curveB.ChangeDimension(srf_dim);

  if ( nurbs_curveA.IsRational() )
    nurbs_curveB.MakeRational();
  else if ( nurbs_curveB.IsRational() )
    nurbs_curveA.MakeRational();

  // reserve enough room in nurbs_curveA.m_cv 
  // for two rows of surface cvs.
  const int is_rat = nurbs_curveA.m_is_rat ? 1 : 0;
  if ( is_rat )
  {
    nurbs_curveA.m_is_rat = 0;
    nurbs_curveA.m_dim++;
  }
  nurbs_curveA.ChangeDimension( 2*nurbs_curveA.m_dim );
  nurbs_curveA.m_dim = srf_dim;
  nurbs_curveA.m_is_rat = is_rat;

  // transfer m_cv and m_knot[0] memory from nurbs_curveA to
  // this nurbs surface.
  if ( m_cv && m_cv_capacity > 0 )
    onfree(m_cv);
  m_cv = nurbs_curveA.m_cv;
  m_cv_capacity = nurbs_curveA.m_cv_capacity;
  nurbs_curveA.m_cv_capacity = 0;

  if ( m_knot[0] && m_knot_capacity[0] > 0 )
    onfree(m_knot[0]);

  // transfer knot vector from nurbs_curveA to srf.m_knot[0]
  nurbs_curveA.UnmanageKnotForExperts(m_knot_capacity[0], m_knot[0]);

  // Fill in linear knots
  ReserveKnotCapacity( 1, 2 );
  m_knot[1][0] = 0.0;
  m_knot[1][1] = 1.0;

  m_dim = srf_dim;
  m_is_rat = nurbs_curveA.m_is_rat;
  m_order[0] = nurbs_curveA.m_order;
  m_order[1] = 2;
  m_cv_count[0] = nurbs_curveA.m_cv_count;
  m_cv_count[1] = 2;
  m_cv_stride[0] = nurbs_curveA.m_cv_stride;
  m_cv_stride[1] = m_cv_stride[0]/2;

  // fill in "B" row of cvs
  for ( int i = 0; i < m_cv_count[0]; i++ )
  {
    SetCV(i,1,ON::intrinsic_point_style, nurbs_curveB.CV(i));
  }

  return ((rcA<=rcB) ? rcB : rcA);
}